

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::Destroy(FlowGraph *this)

{
  undefined1 *puVar1;
  RegionType RVar2;
  IRKind IVar3;
  OpCode OVar4;
  YieldOffsetResumeLabelList *pYVar5;
  Type pPVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  BasicBlock *pBVar8;
  Loop *pLVar9;
  Instr *pIVar10;
  Region *pRVar11;
  Region *pRVar12;
  code *pcVar13;
  bool bVar14;
  BOOL BVar15;
  undefined4 *puVar16;
  LabelInstr *pLVar17;
  JITTimeFunctionBody *this_00;
  LabelInstr **ppLVar18;
  Type *ppBVar19;
  Type *ppFVar20;
  BasicBlock *pBVar21;
  BranchInstr *pBVar22;
  Func **ppFVar23;
  Instr *pIVar24;
  Func **ppFVar25;
  char *pcVar26;
  BasicBlock *pBVar27;
  char *pcVar28;
  BasicBlock *pBVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 local_68 [8];
  Iterator __iter;
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *local_50;
  BasicBlock *intermediateBlock;
  Type local_38;
  
  BVar15 = Func::HasTry(this->func);
  if (BVar15 != 0) {
    RemoveUnreachableBlocks(this);
  }
  pBVar29 = (BasicBlock *)&this->blockList;
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pBVar21 = pBVar29;
LAB_003fba8a:
  pBVar21 = pBVar21->next;
  if (pBVar21 == (BasicBlock *)0x0) goto LAB_003fbf1c;
  pIVar24 = pBVar21->firstInstr;
  if ((*(ushort *)&pBVar21->field_0x18 & 3) == 1) {
    if ((pIVar24->m_kind != InstrKindProfiledLabel) && (pIVar24->m_kind != InstrKindLabel))
    goto LAB_003fba8a;
    pLVar17 = IR::Instr::AsLabelInstr(pIVar24);
    pLVar17->m_block = (BasicBlock *)0x0;
    if (BVar15 != 0) goto LAB_003fba8a;
    this_00 = Func::GetJITFunctionBody(this->func);
    bVar14 = JITTimeFunctionBody::IsCoroutine(this_00);
    if (bVar14) {
      pYVar5 = this->func->m_yieldOffsetResumeLabelList;
      lVar31 = -1;
      lVar32 = -0x18;
      do {
        lVar33 = lVar32;
        lVar31 = lVar31 + 1;
        if ((pYVar5->
            super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
            ).count <= lVar31) goto LAB_003fbb54;
        pPVar6 = (pYVar5->
                 super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).buffer;
        ppLVar18 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second
                             ((Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
                              ((long)&pPVar6[1].first + lVar33));
        lVar32 = lVar33 + 0x18;
      } while (pLVar17 != *ppLVar18);
      pLVar17->field_0x78 = pLVar17->field_0x78 & 0xfb;
      Func::RemoveYieldOffsetResumeLabel
                (this->func,(YieldOffsetResumeLabel *)((long)&pPVar6[1].first + lVar33));
    }
LAB_003fbb54:
    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (pLVar17->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar17->labelRefs) &&
       ((pLVar17->field_0x78 & 4) == 0)) goto LAB_003fbf0f;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                        ,0x690,"(labelInstr->IsUnreferenced())","labelInstr->IsUnreferenced()");
    if (!bVar14) goto LAB_003fc7d5;
    *puVar16 = 0;
  }
  else {
    if ((*(ushort *)&pBVar21->field_0x18 & 6) == 4) {
      if (((pIVar24->m_kind != InstrKindProfiledLabel) && (pIVar24->m_kind != InstrKindLabel)) ||
         (pLVar17 = IR::Instr::AsLabelInstr(pIVar24), (pLVar17->field_0x78 & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar14 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                            ,0x69e,
                            "(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop)"
                            ,"Label not marked as loop top...");
        if (!bVar14) goto LAB_003fc7d5;
        *puVar16 = 0;
      }
      __iter.current = (NodeBase *)&pBVar21->loop->blockList;
      local_38 = (Type)0x0;
      local_50 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current;
LAB_003fbc39:
      if (local_50 == (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar14 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar14) goto LAB_003fc7d5;
        *puVar16 = 0;
      }
      local_50 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                 (local_50->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (local_50 != (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current) {
        ppBVar19 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&__iter.current);
        if (((*ppBVar19)->field_0x18 & 1) == 0) {
          local_68 = (undefined1  [8])&(*ppBVar19)->succList;
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_68;
          do {
            if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar14) goto LAB_003fc7d5;
              *puVar16 = 0;
            }
            pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                     ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            if ((undefined1  [8])pSVar7 == local_68) goto LAB_003fbc39;
            __iter.list = pSVar7;
            ppFVar20 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 ((Iterator *)local_68);
            pBVar8 = (*ppFVar20)->succBlock;
            if (pBVar8 == (BasicBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                  ,0x6a1,"(succ)","succ");
              if (!bVar14) goto LAB_003fc7d5;
              *puVar16 = 0;
            }
          } while (pBVar8 != pBVar21);
          local_38 = *ppBVar19;
        }
        goto LAB_003fbc39;
      }
      if (local_38 == (Type)0x0) {
        pLVar17 = IR::Instr::AsLabelInstr(pIVar24);
        pLVar17->field_0x78 = pLVar17->field_0x78 & 0xfe;
      }
      else {
        pBVar8 = local_38->next;
        ppFVar25 = (Func **)&pBVar8->firstInstr;
        if (pBVar8 == (BasicBlock *)0x0) {
          ppFVar25 = &local_38->func;
        }
        lVar31 = 0x18;
        if (pBVar8 == (BasicBlock *)0x0) {
          lVar31 = 0xd0;
        }
        if (*(char *)(*(long *)((long)&(*ppFVar25)->m_alloc + lVar31) + 0x39) != '\x02') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar14 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x6ad,"(loopTail->GetLastInstr()->IsBranchInstr())",
                              "LastInstr of loop should always be a branch no?");
          if (!bVar14) goto LAB_003fc7d5;
          *puVar16 = 0;
        }
        pLVar9 = pBVar21->loop;
        pLVar17 = IR::Instr::AsLabelInstr(pBVar21->firstInstr);
        pLVar9->loopTopLabel = pLVar17;
      }
    }
    if (BVar15 != 0) {
      UpdateRegionForBlock(this,pBVar21);
    }
    if ((pIVar24->m_kind != InstrKindProfiledLabel) && (pIVar24->m_kind != InstrKindLabel))
    goto LAB_003fbeb3;
    pLVar17 = IR::Instr::AsLabelInstr(pIVar24);
    pLVar17->m_block = (BasicBlock *)0x0;
    if ((BVar15 != 0) ||
       (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (pLVar17->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next != &pLVar17->labelRefs ||
        ((pLVar17->field_0x78 & 4) != 0)))) goto LAB_003fbeb3;
    pBVar8 = pBVar21->next;
    ppFVar25 = (Func **)&pBVar8->firstInstr;
    if (pBVar8 == (BasicBlock *)0x0) {
      ppFVar25 = &pBVar21->func;
    }
    lVar31 = 0x18;
    if (pBVar8 == (BasicBlock *)0x0) {
      lVar31 = 0xd0;
    }
    pIVar10 = *(Instr **)((long)&(*ppFVar25)->m_alloc + lVar31);
    IR::Instr::Remove(&pLVar17->super_Instr);
    if (pIVar24 == pIVar10) goto LAB_003fba8a;
LAB_003fbeb3:
    pBVar8 = pBVar21->next;
    ppFVar25 = (Func **)&pBVar8->firstInstr;
    if (pBVar8 == (BasicBlock *)0x0) {
      ppFVar25 = &pBVar21->func;
    }
    lVar31 = 0x18;
    if (pBVar8 == (BasicBlock *)0x0) {
      lVar31 = 0xd0;
    }
    pIVar24 = *(Instr **)((long)&(*ppFVar25)->m_alloc + lVar31);
    if (pIVar24->m_kind != InstrKindBranch) goto LAB_003fba8a;
    pLVar17 = (LabelInstr *)IR::Instr::AsBranchInstr(pIVar24);
    bVar14 = IR::BranchInstr::IsConditional((BranchInstr *)pLVar17);
    if ((bVar14) ||
       ((Instr *)(pLVar17->labelRefs).
                 super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator !=
        (pLVar17->super_Instr).m_next)) goto LAB_003fba8a;
  }
LAB_003fbf0f:
  IR::Instr::Remove(&pLVar17->super_Instr);
  goto LAB_003fba8a;
LAB_003fc5a2:
  RVar2 = pRVar11->type;
  if (RVar2 - 3 < 2) {
    if (pRVar11->matchingTryRegion != (Region *)0x0) goto LAB_003fbf31;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    uVar30 = 0x74f;
    pcVar28 = "(region->GetMatchingTryRegion())";
    pcVar26 = "region->GetMatchingTryRegion()";
  }
  else if (RVar2 == RegionTypeTry) {
    bVar14 = Func::DoOptimizeTry(this->func);
    if ((bVar14) ||
       ((bVar14 = Func::IsSimpleJit(this->func), bVar14 && ((this->func->field_0x240 & 0x10) != 0)))
       ) {
      if (pRVar11->matchingFinallyOnExceptRegion == (Region *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = pRVar11->matchingFinallyOnNoExceptRegion != (Region *)0x0;
      }
      if (bVar14 != (pRVar11->matchingCatchRegion != (Region *)0x0)) goto LAB_003fbf31;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      uVar30 = 0x745;
      pcVar28 = 
      "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)))"
      ;
      pcVar26 = 
      "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false))"
      ;
    }
    else {
      if (pRVar11->matchingFinallyOnExceptRegion == (Region *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = pRVar11->matchingFinallyOnNoExceptRegion == (Region *)0x0;
      }
      if (bVar14 != (pRVar11->matchingCatchRegion != (Region *)0x0)) goto LAB_003fbf31;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      uVar30 = 0x749;
      pcVar28 = 
      "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)))"
      ;
      pcVar26 = 
      "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
      ;
    }
  }
  else {
    if ((RVar2 != RegionTypeRoot) ||
       (((pRVar11->matchingTryRegion == (Region *)0x0 &&
         (pRVar11->matchingCatchRegion == (Region *)0x0)) &&
        ((pRVar11->matchingFinallyOnExceptRegion == (Region *)0x0 &&
         (pRVar11->matchingFinallyOnNoExceptRegion == (Region *)0x0)))))) goto LAB_003fbf31;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    uVar30 = 0x73f;
    pcVar28 = 
    "(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
    ;
    pcVar26 = 
    "!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)"
    ;
  }
  bVar14 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,uVar30,pcVar28,pcVar26);
  if (!bVar14) {
LAB_003fc7d5:
    pcVar13 = (code *)invalidInstructionException();
    (*pcVar13)();
  }
  *puVar16 = 0;
  goto LAB_003fbf31;
LAB_003fc104:
  if (pRVar11 == pRVar12) goto LAB_003fbf70;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar16 = 1;
  uVar30 = 0x6ed;
  pcVar28 = "(region == predRegion)";
  pcVar26 = "Bad region propagation through empty block";
LAB_003fc584:
  bVar14 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,uVar30,pcVar28,pcVar26);
  if (!bVar14) goto LAB_003fc7d5;
  *puVar16 = 0;
  goto LAB_003fbf70;
LAB_003fbf1c:
  pBVar21 = pBVar29;
  if (BVar15 != 0) {
LAB_003fbf31:
    while (pBVar21 = pBVar21->next, pBVar21 != (BasicBlock *)0x0) {
      if ((pBVar21->field_0x18 & 1) == 0) {
        pLVar17 = IR::Instr::AsLabelInstr(pBVar21->firstInstr);
        pRVar11 = pLVar17->m_region;
        __iter.current = (NodeBase *)&pBVar21->predList;
        local_50 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current;
LAB_003fbf70:
        if (local_50 == (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar14 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar14) goto LAB_003fc7d5;
          *puVar16 = 0;
        }
        local_50 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                   (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    &local_50->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>)->
                   super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (local_50 == (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current)
        goto LAB_003fc5a2;
        ppFVar20 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&__iter.current);
        pBVar8 = (*ppFVar20)->predBlock;
        if (pBVar8 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar14 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x6e7,"(predBlock)","predBlock");
          if (!bVar14) goto LAB_003fc7d5;
          *puVar16 = 0;
        }
        pLVar17 = IR::Instr::AsLabelInstr(pBVar8->firstInstr);
        pBVar27 = pBVar8->next;
        ppFVar25 = &pBVar8->func;
        ppFVar23 = (Func **)&pBVar27->firstInstr;
        if (pBVar27 == (BasicBlock *)0x0) {
          ppFVar23 = ppFVar25;
        }
        lVar31 = 0x18;
        if (pBVar27 == (BasicBlock *)0x0) {
          lVar31 = 0xd0;
        }
        pRVar12 = pLVar17->m_region;
        pIVar24 = *(Instr **)((long)&(*ppFVar23)->m_alloc + lVar31);
        if (pIVar24 == (Instr *)0x0) goto LAB_003fc104;
        OVar4 = pIVar24->m_opcode;
        if (OVar4 - 0xe7 < 2) {
          if (pRVar11->parent != pRVar12) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar14 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x6f5,"(region->GetParent() == predRegion)",
                                "Bad region prop on entry to try-catch/finally");
            if (!bVar14) goto LAB_003fc7d5;
            *puVar16 = 0;
            pBVar27 = pBVar8->next;
          }
          lVar32 = 0x18;
          pLVar17 = (LabelInstr *)pBVar21->firstInstr;
          lVar31 = lVar32;
          ppFVar23 = (Func **)&pBVar27->firstInstr;
          if (pBVar27 == (BasicBlock *)0x0) {
            lVar31 = 0xd0;
            ppFVar23 = ppFVar25;
          }
          pBVar22 = IR::Instr::AsBranchInstr(*(Instr **)((long)&(*ppFVar23)->m_alloc + lVar31));
          if (pLVar17 == pBVar22->m_branchTarget) {
            ppFVar23 = (Func **)&pBVar8->next->firstInstr;
            if (pBVar8->next == (BasicBlock *)0x0) {
              lVar32 = 0xd0;
              ppFVar23 = ppFVar25;
            }
            if (*(short *)(*(long *)((long)&(*ppFVar23)->m_alloc + lVar32) + 0x30) == 0xe7) {
              if (pRVar11->type == RegionTypeCatch) goto LAB_003fbf70;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              uVar30 = 0x6fa;
              pcVar28 = "(region->GetType() == RegionTypeCatch)";
              pcVar26 = "Bad region type on entry to catch";
            }
            else {
              if (pRVar11->type == RegionTypeFinally) goto LAB_003fbf70;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              uVar30 = 0x6fe;
              pcVar28 = "(region->GetType() == RegionTypeFinally)";
              pcVar26 = "Bad region type on entry to finally";
            }
          }
          else {
            if (pRVar11->type == RegionTypeTry) goto LAB_003fbf70;
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            uVar30 = 0x703;
            pcVar28 = "(region->GetType() == RegionTypeTry)";
            pcVar26 = "Bad region type on entry to try";
          }
        }
        else {
          if (OVar4 != Br) {
            if (OVar4 == LeaveNull) {
              if ((pRVar11 == pRVar12->parent) ||
                 ((pRVar11 == pRVar12 && (bVar14 = Func::IsLoopBodyInTry(this->func), bVar14))))
              goto LAB_003fbf70;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              uVar30 = 0x70d;
              pcVar28 = 
              "(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()))"
              ;
            }
            else {
              if (OVar4 != Leave) {
                if (OVar4 != BrOnException) {
                  if (((OVar4 == BrOnNoException) && (2 < (byte)(pRVar11->type - RegionTypeTry))) &&
                     ((pRVar12->type != RegionTypeFinally ||
                      (pBVar22 = IR::Instr::AsBranchInstr(pIVar24),
                      (pBVar22->field_0x58 & 0x10) == 0)))) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar16 = 1;
                    uVar30 = 0x71e;
                    pcVar28 = 
                    "(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit))"
                    ;
                    pcVar26 = 
                    "region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit)"
                    ;
                    goto LAB_003fc584;
                  }
                  goto LAB_003fbf70;
                }
                bVar14 = Func::DoGlobOpt(this->func);
                if (!bVar14) goto LAB_003fbf70;
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar16 = 1;
                uVar30 = 0x716;
                pcVar28 = "(!this->func->DoGlobOpt())";
                pcVar26 = "!this->func->DoGlobOpt()";
                goto LAB_003fc584;
              }
              if ((pRVar11 == pRVar12->parent) ||
                 ((pRVar12->type == RegionTypeTry &&
                  (pRVar12->matchingFinallyOnNoExceptRegion == pRVar11)))) goto LAB_003fbf70;
              if (pRVar11 == pRVar12) {
                bVar14 = Func::IsLoopBodyInTry(this->func);
                if (bVar14) goto LAB_003fbf70;
                pBVar27 = pBVar8->next;
              }
              ppFVar23 = (Func **)&pBVar27->firstInstr;
              if (pBVar27 == (BasicBlock *)0x0) {
                ppFVar23 = ppFVar25;
              }
              lVar31 = 0x18;
              if (pBVar27 == (BasicBlock *)0x0) {
                lVar31 = 0xd0;
              }
              pIVar24 = IR::Instr::GetPrevRealInstr
                                  (*(Instr **)((long)&(*ppFVar23)->m_alloc + lVar31));
              if (((pIVar24->m_opcode == BailOnEarlyExit) && (pRVar11->type == RegionTypeFinally))
                 && (bVar14 = Func::IsSimpleJit(this->func), bVar14)) goto LAB_003fbf70;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              uVar30 = 0x70a;
              pcVar28 = 
              "(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) || (region == predRegion && this->func->IsLoopBodyInTry() || (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())))"
              ;
            }
            pcVar26 = "Bad region prop on leaving try-catch/finally";
            goto LAB_003fc584;
          }
          pBVar22 = IR::Instr::AsBranchInstr(pIVar24);
          if (pBVar22->m_leaveConvToBr == true) {
            if (pRVar11 == pRVar12->parent) goto LAB_003fbf70;
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            uVar30 = 0x724;
            pcVar28 = "(region == predRegion->GetParent())";
            pcVar26 = "Bad region prop in finally";
          }
          else {
            if (pRVar11 == pRVar12 || pRVar11->type != RegionTypeCatch) {
              RVar2 = pRVar12->type;
              if (pRVar11->type != RegionTypeFinally || pRVar11 == pRVar12) {
                if (RVar2 == RegionTypeFinally) {
                  bVar14 = pRVar12->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar12;
                }
                else {
                  bVar14 = false;
                }
                if ((pRVar11 != pRVar12) && (!bVar14)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar16 = 1;
                  uVar30 = 0x732;
                  pcVar28 = "(predRegion->IsNonExceptingFinally() || region == predRegion)";
                  pcVar26 = "Bad region propagation through interior block";
                  goto LAB_003fc584;
                }
                goto LAB_003fbf70;
              }
              if ((RVar2 == RegionTypeTry) ||
                 ((RVar2 == RegionTypeFinally &&
                  (pRVar12->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar12))))
              goto LAB_003fbf70;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              uVar30 = 0x72d;
              pcVar28 = 
              "(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry)";
            }
            else {
              if (pRVar12->type == RegionTypeTry) goto LAB_003fbf70;
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar16 = 1;
              uVar30 = 0x728;
              pcVar28 = "(predRegion->GetType() == RegionTypeTry)";
            }
            pcVar26 = "Bad region type for the try";
          }
        }
        goto LAB_003fc584;
      }
    }
    while (pBVar29 = pBVar29->next, pBVar29 != (BasicBlock *)0x0) {
      IVar3 = pBVar29->firstInstr->m_kind;
      if ((((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) &&
          (pLVar17 = IR::Instr::AsLabelInstr(pBVar29->firstInstr),
          (SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
          (pLVar17->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar17->labelRefs)) &&
         ((pLVar17->field_0x78 & 4) == 0)) {
        IR::Instr::Remove(&pLVar17->super_Instr);
      }
    }
  }
  puVar1 = &this->func->field_0x240;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xfffbffff;
  return;
}

Assistant:

void
FlowGraph::Destroy(void)
{
    BOOL fHasTry = this->func->HasTry();
    if (fHasTry)
    {
        // Do unreachable code removal up front to avoid problems
        // with unreachable back edges, etc.
        this->RemoveUnreachableBlocks();
    }

    FOREACH_BLOCK_ALL(block, this)
    {
        IR::Instr * firstInstr = block->GetFirstInstr();
        if (block->isDeleted && !block->isDead)
        {
            if (firstInstr->IsLabelInstr())
            {
                IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
                labelInstr->UnlinkBasicBlock();
                // Removing the label for non try blocks as we have a deleted block which has the label instruction
                // still not removed; this prevents the assert for cases where the deleted blocks fall through to a helper block,
                // i.e. helper introduced by polymorphic inlining bailout.
                // Skipping Try blocks as we have dependency on blocks to get the last instr(see below in this function)
                if (!fHasTry)
                {
                    if (this->func->GetJITFunctionBody()->IsCoroutine())
                    {
                        // the label could be a yield resume label, in which case we also need to remove it from the YieldOffsetResumeLabels list
                        this->func->MapUntilYieldOffsetResumeLabels([this, &labelInstr](int i, const YieldOffsetResumeLabel& yorl)
                        {
                            if (labelInstr == yorl.Second())
                            {
                                labelInstr->m_hasNonBranchRef = false;
                                this->func->RemoveYieldOffsetResumeLabel(yorl);
                                return true;
                            }
                            return false;
                        });
                    }

                    Assert(labelInstr->IsUnreferenced());
                    labelInstr->Remove();
                }
            }
            continue;
        }

        if (block->isLoopHeader && !block->isDead)
        {
            // Mark the tail block of this loop (the last back-edge).  The register allocator
            // uses this to lexically find loops.
            BasicBlock *loopTail = nullptr;

            AssertMsg(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop,
                "Label not marked as loop top...");
            FOREACH_BLOCK_IN_LOOP(loopBlock, block->loop)
            {
                FOREACH_SUCCESSOR_BLOCK(succ, loopBlock)
                {
                    if (succ == block)
                    {
                        loopTail = loopBlock;
                        break;
                    }
                } NEXT_SUCCESSOR_BLOCK;
            } NEXT_BLOCK_IN_LOOP;

            if (loopTail)
            {
                AssertMsg(loopTail->GetLastInstr()->IsBranchInstr(), "LastInstr of loop should always be a branch no?");
                block->loop->SetLoopTopInstr(block->GetFirstInstr()->AsLabelInstr());
            }
            else
            {
                // This loop doesn't have a back-edge: that is, it is not a loop
                // anymore...
                firstInstr->AsLabelInstr()->m_isLoopTop = FALSE;
            }
        }

        if (fHasTry)
        {
            this->UpdateRegionForBlock(block);
        }

        if (firstInstr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
            labelInstr->UnlinkBasicBlock();
            if (labelInstr->IsUnreferenced() && !fHasTry)
            {
                // This is an unreferenced label, probably added by FG building.
                // Delete it now to make extended basic blocks visible.
                if (firstInstr == block->GetLastInstr())
                {
                    labelInstr->Remove();
                    continue;
                }
                else
                {
                    labelInstr->Remove();
                }
            }
        }

        IR::Instr * lastInstr = block->GetLastInstr();
        if (lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();
            if (!branchInstr->IsConditional() && branchInstr->GetTarget() == branchInstr->m_next)
            {
                // Remove branch to next
                branchInstr->Remove();
            }
        }
    }
    NEXT_BLOCK;

#if DBG

    if (fHasTry)
    {
        // Now that all blocks have regions, we should see consistently propagated regions at all
        // block boundaries.
        FOREACH_BLOCK(block, this)
        {
            Region * region = block->GetFirstInstr()->AsLabelInstr()->GetRegion();
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                BasicBlock* intermediateBlock = block;
                Region * predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predBlock->GetLastInstr() == nullptr)
                {
                    AssertMsg(region == predRegion, "Bad region propagation through empty block");
                }
                else
                {
                    switch (predBlock->GetLastInstr()->m_opcode)
                    {
                    case Js::OpCode::TryCatch:
                    case Js::OpCode::TryFinally:
                        AssertMsg(region->GetParent() == predRegion, "Bad region prop on entry to try-catch/finally");
                        if (intermediateBlock->GetFirstInstr() == predBlock->GetLastInstr()->AsBranchInstr()->GetTarget())
                        {
                            if (predBlock->GetLastInstr()->m_opcode == Js::OpCode::TryCatch)
                            {
                                AssertMsg(region->GetType() == RegionTypeCatch, "Bad region type on entry to catch");
                            }
                            else
                            {
                                AssertMsg(region->GetType() == RegionTypeFinally, "Bad region type on entry to finally");
                            }
                        }
                        else
                        {
                            AssertMsg(region->GetType() == RegionTypeTry, "Bad region type on entry to try");
                        }
                        break;
                    case Js::OpCode::Leave:
                        AssertMsg(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) ||
                            (region == predRegion && this->func->IsLoopBodyInTry() ||
                            // edge from early exit to finally in simplejit - in fulljit this Leave would have been deadcoded due to preceeding BailOutOnEarlyExit
                            (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())), "Bad region prop on leaving try-catch/finally");
                        break;
                    case Js::OpCode::LeaveNull:
                        AssertMsg(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()), "Bad region prop on leaving try-catch/finally");
                        break;

                    // If the try region has a branch out of the loop,
                    // - the branch is moved out of the loop as part of break block removal, and
                    // - BrOnException is inverted to BrOnNoException and a Br is inserted after it.
                    // Otherwise,
                    // - FullJit: BrOnException is removed in the forward pass.
                    case Js::OpCode::BrOnException:
                        Assert(!this->func->DoGlobOpt());
                        break;
                    case Js::OpCode::BrOnNoException:
                        Assert(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally ||
                            // A BrOnException from finally to early exit can be converted to BrOnNoException and Br
                            // The Br block maybe a common successor block for early exit along with the BrOnNoException block
                            // Region from Br block will be picked up from a predecessor which is not BrOnNoException due to early exit
                            // See test0() in test/EH/tryfinallytests.js
                            (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit));
                        break;
                    case Js::OpCode::Br:
                        if (predBlock->GetLastInstr()->AsBranchInstr()->m_leaveConvToBr)
                        {
                            // Leave converted to Br in finally region
                            AssertMsg(region == predRegion->GetParent(), "Bad region prop in finally");
                        }
                        else if (region->GetType() == RegionTypeCatch && region != predRegion)
                        {
                            AssertMsg(predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else if (region->GetType() == RegionTypeFinally && region != predRegion)
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || region == predRegion, "Bad region propagation through interior block");
                        }
                        break;
                    default:
                        break;
                    }
                }
            }
            NEXT_PREDECESSOR_BLOCK;

            switch (region->GetType())
            {
            case RegionTypeRoot:
                Assert(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false));
                break;

            case RegionTypeTry:
                if (this->func->DoOptimizeTry() || (this->func->IsSimpleJit() && this->func->hasBailout))
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)));
                }
                else
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)));
                }
                break;

            case RegionTypeCatch:
            case RegionTypeFinally:
                Assert(region->GetMatchingTryRegion());
                break;
            }
        }
        NEXT_BLOCK;
    }
#endif
    if (fHasTry)
    {
        FOREACH_BLOCK_ALL(block, this)
        {
            if (block->GetFirstInstr()->IsLabelInstr())
            {
                IR::LabelInstr *labelInstr = block->GetFirstInstr()->AsLabelInstr();
                if (labelInstr->IsUnreferenced())
                {
                    // This is an unreferenced label, probably added by FG building.
                    // Delete it now to make extended basic blocks visible.
                    labelInstr->Remove();
                }
            }
        } NEXT_BLOCK;
    }
    this->func->isFlowGraphValid = false;
}